

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TxFormats.cpp
# Opt level: O0

void __thiscall jbcoin::TxFormats::TxFormats(TxFormats *this)

{
  Item *pIVar1;
  SOElement local_410;
  SOElement local_400;
  SOElement local_3f0;
  SOElement local_3e0;
  SOElement local_3d0;
  SOElement local_3c0;
  SOElement local_3b0;
  SOElement local_3a0;
  SOElement local_390;
  SOElement local_380;
  SOElement local_370;
  SOElement local_360;
  SOElement local_350;
  SOElement local_340;
  SOElement local_330;
  SOElement local_320;
  SOElement local_310;
  SOElement local_300;
  SOElement local_2f0;
  SOElement local_2e0;
  SOElement local_2d0;
  SOElement local_2c0;
  SOElement local_2b0;
  SOElement local_2a0;
  SOElement local_290;
  SOElement local_280;
  SOElement local_270;
  SOElement local_260;
  SOElement local_250;
  SOElement local_240;
  SOElement local_230;
  SOElement local_220;
  SOElement local_210;
  SOElement local_200;
  SOElement local_1f0;
  SOElement local_1e0;
  SOElement local_1d0;
  SOElement local_1c0;
  SOElement local_1b0;
  SOElement local_1a0;
  SOElement local_190;
  SOElement local_180;
  SOElement local_170;
  SOElement local_160;
  SOElement local_150;
  SOElement local_140;
  SOElement local_130;
  SOElement local_120;
  SOElement local_110;
  SOElement local_100;
  SOElement local_f0;
  SOElement local_e0;
  SOElement local_d0;
  SOElement local_c0;
  SOElement local_b0;
  SOElement local_a0;
  SOElement local_90;
  SOElement local_80;
  SOElement local_70;
  SOElement local_60;
  SOElement local_50;
  SOElement local_40;
  SOElement local_30 [2];
  TxFormats *local_10;
  TxFormats *this_local;
  
  local_10 = this;
  KnownFormats<jbcoin::TxType>::KnownFormats(&this->super_KnownFormats<jbcoin::TxType>);
  (this->super_KnownFormats<jbcoin::TxType>)._vptr_KnownFormats =
       (_func_int **)&PTR_addCommonFields_00519d48;
  pIVar1 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"AccountSet",ttACCOUNT_SET);
  SOElement::SOElement(local_30,(SField *)sfEmailHash,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,local_30);
  SOElement::SOElement(&local_40,(SField *)sfWalletLocator,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_40);
  SOElement::SOElement(&local_50,(SField *)sfWalletSize,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_50);
  SOElement::SOElement(&local_60,(SField *)sfMessageKey,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_60);
  SOElement::SOElement(&local_70,(SField *)sfDomain,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_70);
  SOElement::SOElement(&local_80,(SField *)sfTransferRate,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_80);
  SOElement::SOElement(&local_90,(SField *)sfSetFlag,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_90);
  SOElement::SOElement(&local_a0,(SField *)sfClearFlag,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_a0);
  SOElement::SOElement(&local_b0,(SField *)sfTickSize,SOE_OPTIONAL);
  KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_b0);
  pIVar1 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"TrustSet",ttTRUST_SET);
  SOElement::SOElement(&local_c0,(SField *)sfLimitAmount,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_c0);
  SOElement::SOElement(&local_d0,(SField *)sfQualityIn,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_d0);
  SOElement::SOElement(&local_e0,(SField *)sfQualityOut,SOE_OPTIONAL);
  KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_e0);
  pIVar1 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"OfferCreate",ttOFFER_CREATE);
  SOElement::SOElement(&local_f0,(SField *)sfTakerPays,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_f0);
  SOElement::SOElement(&local_100,(SField *)sfTakerGets,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_100);
  SOElement::SOElement(&local_110,(SField *)sfExpiration,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_110);
  SOElement::SOElement(&local_120,(SField *)sfOfferSequence,SOE_OPTIONAL);
  KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_120);
  pIVar1 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"OfferCancel",ttOFFER_CANCEL);
  SOElement::SOElement(&local_130,(SField *)sfOfferSequence,SOE_REQUIRED);
  KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_130);
  pIVar1 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"SetRegularKey",ttREGULAR_KEY_SET);
  SOElement::SOElement(&local_140,(SField *)sfRegularKey,SOE_OPTIONAL);
  KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_140);
  pIVar1 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"Payment",ttPAYMENT);
  SOElement::SOElement(&local_150,(SField *)sfDestination,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_150);
  SOElement::SOElement(&local_160,(SField *)sfAmount,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_160);
  SOElement::SOElement(&local_170,(SField *)sfSendMax,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_170);
  SOElement::SOElement(&local_180,(SField *)sfPaths,SOE_DEFAULT);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_180);
  SOElement::SOElement(&local_190,(SField *)sfInvoiceID,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_190);
  SOElement::SOElement(&local_1a0,(SField *)sfDestinationTag,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_1a0);
  SOElement::SOElement(&local_1b0,(SField *)sfDeliverMin,SOE_OPTIONAL);
  KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_1b0);
  pIVar1 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"EscrowCreate",ttESCROW_CREATE);
  SOElement::SOElement(&local_1c0,(SField *)sfDestination,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_1c0);
  SOElement::SOElement(&local_1d0,(SField *)sfAmount,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_1d0);
  SOElement::SOElement(&local_1e0,(SField *)sfCondition,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_1e0);
  SOElement::SOElement(&local_1f0,(SField *)sfCancelAfter,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_1f0);
  SOElement::SOElement(&local_200,(SField *)sfFinishAfter,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_200);
  SOElement::SOElement(&local_210,(SField *)sfDestinationTag,SOE_OPTIONAL);
  KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_210);
  pIVar1 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"EscrowFinish",ttESCROW_FINISH);
  SOElement::SOElement(&local_220,(SField *)sfOwner,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_220);
  SOElement::SOElement(&local_230,(SField *)sfOfferSequence,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_230);
  SOElement::SOElement(&local_240,(SField *)sfFulfillment,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_240);
  SOElement::SOElement(&local_250,(SField *)sfCondition,SOE_OPTIONAL);
  KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_250);
  pIVar1 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"EscrowCancel",ttESCROW_CANCEL);
  SOElement::SOElement(&local_260,(SField *)sfOwner,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_260);
  SOElement::SOElement(&local_270,(SField *)sfOfferSequence,SOE_REQUIRED);
  KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_270);
  pIVar1 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"EnableAmendment",ttAMENDMENT);
  SOElement::SOElement(&local_280,(SField *)sfLedgerSequence,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_280);
  SOElement::SOElement(&local_290,(SField *)sfAmendment,SOE_REQUIRED);
  KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_290);
  pIVar1 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"SetFee",ttFEE);
  SOElement::SOElement(&local_2a0,(SField *)sfLedgerSequence,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_2a0);
  SOElement::SOElement(&local_2b0,(SField *)sfBaseFee,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_2b0);
  SOElement::SOElement(&local_2c0,(SField *)sfReferenceFeeUnits,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_2c0);
  SOElement::SOElement(&local_2d0,(SField *)sfReserveBase,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_2d0);
  SOElement::SOElement(&local_2e0,(SField *)sfReserveIncrement,SOE_REQUIRED);
  KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_2e0);
  pIVar1 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"TicketCreate",ttTICKET_CREATE);
  SOElement::SOElement(&local_2f0,(SField *)sfTarget,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_2f0);
  SOElement::SOElement(&local_300,(SField *)sfExpiration,SOE_OPTIONAL);
  KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_300);
  pIVar1 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"TicketCancel",ttTICKET_CANCEL);
  SOElement::SOElement(&local_310,(SField *)sfTicketID,SOE_REQUIRED);
  KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_310);
  pIVar1 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"SignerListSet",ttSIGNER_LIST_SET);
  SOElement::SOElement(&local_320,(SField *)sfSignerQuorum,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_320);
  SOElement::SOElement(&local_330,(SField *)sfSignerEntries,SOE_OPTIONAL);
  KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_330);
  pIVar1 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"PaymentChannelCreate",
                      ttPAYCHAN_CREATE);
  SOElement::SOElement(&local_340,(SField *)sfDestination,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_340);
  SOElement::SOElement(&local_350,(SField *)sfAmount,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_350);
  SOElement::SOElement(&local_360,(SField *)sfSettleDelay,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_360);
  SOElement::SOElement(&local_370,(SField *)sfPublicKey,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_370);
  SOElement::SOElement(&local_380,(SField *)sfCancelAfter,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_380);
  SOElement::SOElement(&local_390,(SField *)sfDestinationTag,SOE_OPTIONAL);
  KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_390);
  pIVar1 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"PaymentChannelFund",ttPAYCHAN_FUND)
  ;
  SOElement::SOElement(&local_3a0,(SField *)sfPayChannel,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_3a0);
  SOElement::SOElement(&local_3b0,(SField *)sfAmount,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_3b0);
  SOElement::SOElement(&local_3c0,(SField *)sfExpiration,SOE_OPTIONAL);
  KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_3c0);
  pIVar1 = KnownFormats<jbcoin::TxType>::add
                     (&this->super_KnownFormats<jbcoin::TxType>,"PaymentChannelClaim",
                      ttPAYCHAN_CLAIM);
  SOElement::SOElement(&local_3d0,(SField *)sfPayChannel,SOE_REQUIRED);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_3d0);
  SOElement::SOElement(&local_3e0,(SField *)sfAmount,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_3e0);
  SOElement::SOElement(&local_3f0,(SField *)sfBalance,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_3f0);
  SOElement::SOElement(&local_400,(SField *)sfSignature,SOE_OPTIONAL);
  pIVar1 = KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_400);
  SOElement::SOElement(&local_410,(SField *)sfPublicKey,SOE_OPTIONAL);
  KnownFormats<jbcoin::TxType>::Item::operator<<(pIVar1,&local_410);
  return;
}

Assistant:

TxFormats::TxFormats ()
{
    add ("AccountSet", ttACCOUNT_SET)
        << SOElement (sfEmailHash,           SOE_OPTIONAL)
        << SOElement (sfWalletLocator,       SOE_OPTIONAL)
        << SOElement (sfWalletSize,          SOE_OPTIONAL)
        << SOElement (sfMessageKey,          SOE_OPTIONAL)
        << SOElement (sfDomain,              SOE_OPTIONAL)
        << SOElement (sfTransferRate,        SOE_OPTIONAL)
        << SOElement (sfSetFlag,             SOE_OPTIONAL)
        << SOElement (sfClearFlag,           SOE_OPTIONAL)
        << SOElement (sfTickSize,            SOE_OPTIONAL)
        ;

    add ("TrustSet", ttTRUST_SET)
        << SOElement (sfLimitAmount,         SOE_OPTIONAL)
        << SOElement (sfQualityIn,           SOE_OPTIONAL)
        << SOElement (sfQualityOut,          SOE_OPTIONAL)
        ;

    add ("OfferCreate", ttOFFER_CREATE)
        << SOElement (sfTakerPays,           SOE_REQUIRED)
        << SOElement (sfTakerGets,           SOE_REQUIRED)
        << SOElement (sfExpiration,          SOE_OPTIONAL)
        << SOElement (sfOfferSequence,       SOE_OPTIONAL)
        ;

    add ("OfferCancel", ttOFFER_CANCEL)
        << SOElement (sfOfferSequence,       SOE_REQUIRED)
        ;

    add ("SetRegularKey", ttREGULAR_KEY_SET)
        << SOElement (sfRegularKey,          SOE_OPTIONAL)
        ;

    add ("Payment", ttPAYMENT)
        << SOElement (sfDestination,         SOE_REQUIRED)
        << SOElement (sfAmount,              SOE_REQUIRED)
        << SOElement (sfSendMax,             SOE_OPTIONAL)
        << SOElement (sfPaths,               SOE_DEFAULT)
        << SOElement (sfInvoiceID,           SOE_OPTIONAL)
        << SOElement (sfDestinationTag,      SOE_OPTIONAL)
        << SOElement (sfDeliverMin,          SOE_OPTIONAL)
        ;

    add ("EscrowCreate", ttESCROW_CREATE) <<
        SOElement (sfDestination,       SOE_REQUIRED) <<
        SOElement (sfAmount,            SOE_REQUIRED) <<
        SOElement (sfCondition,         SOE_OPTIONAL) <<
        SOElement (sfCancelAfter,       SOE_OPTIONAL) <<
        SOElement (sfFinishAfter,       SOE_OPTIONAL) <<
        SOElement (sfDestinationTag,    SOE_OPTIONAL);

    add ("EscrowFinish", ttESCROW_FINISH) <<
        SOElement (sfOwner,               SOE_REQUIRED) <<
        SOElement (sfOfferSequence,       SOE_REQUIRED) <<
        SOElement (sfFulfillment,         SOE_OPTIONAL) <<
        SOElement (sfCondition,           SOE_OPTIONAL);

    add ("EscrowCancel", ttESCROW_CANCEL) <<
        SOElement (sfOwner,               SOE_REQUIRED) <<
        SOElement (sfOfferSequence,       SOE_REQUIRED);

    add ("EnableAmendment", ttAMENDMENT)
        << SOElement (sfLedgerSequence,      SOE_REQUIRED)
        << SOElement (sfAmendment,           SOE_REQUIRED)
        ;

    add ("SetFee", ttFEE)
        << SOElement (sfLedgerSequence,      SOE_OPTIONAL)
        << SOElement (sfBaseFee,             SOE_REQUIRED)
        << SOElement (sfReferenceFeeUnits,   SOE_REQUIRED)
        << SOElement (sfReserveBase,         SOE_REQUIRED)
        << SOElement (sfReserveIncrement,    SOE_REQUIRED)
        ;

    add ("TicketCreate", ttTICKET_CREATE)
        << SOElement (sfTarget,              SOE_OPTIONAL)
        << SOElement (sfExpiration,          SOE_OPTIONAL)
        ;

    add ("TicketCancel", ttTICKET_CANCEL)
        << SOElement (sfTicketID,            SOE_REQUIRED)
        ;

    // The SignerEntries are optional because a SignerList is deleted by
    // setting the SignerQuorum to zero and omitting SignerEntries.
    add ("SignerListSet", ttSIGNER_LIST_SET)
        << SOElement (sfSignerQuorum,        SOE_REQUIRED)
        << SOElement (sfSignerEntries,       SOE_OPTIONAL)
        ;

    add ("PaymentChannelCreate", ttPAYCHAN_CREATE) <<
            SOElement (sfDestination,       SOE_REQUIRED) <<
            SOElement (sfAmount,            SOE_REQUIRED) <<
            SOElement (sfSettleDelay,       SOE_REQUIRED) <<
            SOElement (sfPublicKey,         SOE_REQUIRED) <<
            SOElement (sfCancelAfter,       SOE_OPTIONAL) <<
            SOElement (sfDestinationTag,    SOE_OPTIONAL);

    add ("PaymentChannelFund", ttPAYCHAN_FUND) <<
            SOElement (sfPayChannel,        SOE_REQUIRED) <<
            SOElement (sfAmount,            SOE_REQUIRED) <<
            SOElement (sfExpiration,        SOE_OPTIONAL);

    add ("PaymentChannelClaim", ttPAYCHAN_CLAIM) <<
            SOElement (sfPayChannel,        SOE_REQUIRED) <<
            SOElement (sfAmount,            SOE_OPTIONAL) <<
            SOElement (sfBalance,           SOE_OPTIONAL) <<
            SOElement (sfSignature,         SOE_OPTIONAL) <<
            SOElement (sfPublicKey,         SOE_OPTIONAL);
}